

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

FTexture * __thiscall FTextureManager::operator()(FTextureManager *this,char *texname)

{
  FTextureID FVar1;
  int *piVar2;
  TextureHash *pTVar3;
  FTextureID texnum;
  char *texname_local;
  FTextureManager *this_local;
  
  FVar1 = GetTexture(this,texname,8,0);
  if (FVar1.texnum == -1) {
    this_local = (FTextureManager *)0x0;
  }
  else {
    piVar2 = TArray<int,_int>::operator[](&this->Translation,(long)FVar1.texnum);
    pTVar3 = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::operator[]
                       (&this->Textures,(long)*piVar2);
    this_local = (FTextureManager *)pTVar3->Texture;
  }
  return (FTexture *)this_local;
}

Assistant:

FTexture *operator() (const char *texname)
	{
		FTextureID texnum = GetTexture (texname, FTexture::TEX_MiscPatch);
		if (texnum.texnum == -1) return NULL;
		return Textures[Translation[texnum.texnum]].Texture;
	}